

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

void __thiscall
rtb::Filter::Filter<double>::Filter(Filter<double> *this,TransferFunction<double> *tf)

{
  size_t sVar1;
  allocator_type local_29;
  value_type local_28;
  
  TransferFunction<double>::TransferFunction(&this->tf_,tf);
  local_28._M_value._0_8_ = 0;
  local_28._M_value._8_8_ = 0;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&this->x_,(this->tf_).numerator_.size_,&local_28,&local_29);
  local_28._M_value._0_8_ = 0;
  local_28._M_value._8_8_ = 0;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&this->y_,(this->tf_).denominator_.size_,&local_28,&local_29);
  this->count_ = 0;
  sVar1 = (this->tf_).numerator_.size_;
  this->n_ = (this->tf_).denominator_.size_;
  this->m_ = sVar1;
  return;
}

Assistant:

Filter<T>::Filter(const TransferFunction<T>& tf) :
            tf_(tf),
            count_(0),
            y_(tf_.getDenominatorSize(), .0),
            x_(tf_.getNumeratorSize(), .0),
            n_(tf_.getDenominatorSize()),
            m_(tf_.getNumeratorSize())  { }